

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Talk.cpp
# Opt level: O0

void Handlers::Talk_Open(Character *character,PacketReader *reader)

{
  World *pWVar1;
  Party *this;
  int iVar2;
  time_t tVar3;
  mapped_type *this_00;
  string local_90;
  allocator<char> local_59;
  key_type local_58;
  undefined1 local_38 [8];
  string message;
  PacketReader *reader_local;
  Character *character_local;
  
  if ((character->party != (Party *)0x0) &&
     (iVar2 = character->muted_until, message.field_2._8_8_ = reader, tVar3 = time((time_t *)0x0),
     iVar2 <= tVar3)) {
    PacketReader::GetEndString_abi_cxx11_((string *)local_38,(PacketReader *)message.field_2._8_8_);
    pWVar1 = character->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"ChatLength",&local_59);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar1->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_58);
    iVar2 = util::variant::operator_cast_to_int(this_00);
    limit_message((string *)local_38,(long)iVar2);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    this = character->party;
    std::__cxx11::string::string((string *)&local_90,(string *)local_38);
    Party::Msg(this,character,&local_90,false);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void Talk_Open(Character *character, PacketReader &reader)
{
	if (!character->party) return;
	if (character->muted_until > time(0)) return;

	std::string message = reader.GetEndString(); // message
	limit_message(message, static_cast<int>(character->world->config["ChatLength"]));

	character->party->Msg(character, message, false);
}